

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

void backtracer_anything(t_backtracer *x,t_symbol *s,int argc,t_atom *argv)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  t_msgstack *fatso;
  ulong uVar4;
  long lVar5;
  _outconnect *p_Var6;
  
  fatso = (t_msgstack *)getbytes(0x70);
  fatso->m_next = backtracer_stack;
  backtracer_stack = fatso;
  fatso->m_sel = s;
  fatso->m_argc = argc;
  if (0 < argc) {
    uVar4 = 5;
    if (argc < 5) {
      uVar4 = (ulong)(uint)argc;
    }
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)&argv->a_type + lVar5);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&fatso->m_argv[0].a_type + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 * 0x10 != lVar5);
  }
  fatso->m_owner = x;
  if (backtracer_tracing != 0) {
    backtracer_printmsg(x->b_owner,s,argc,argv);
  }
  for (p_Var6 = x->b_connections; p_Var6 != (_outconnect *)0x0; p_Var6 = p_Var6->oc_next) {
    pd_typedmess(p_Var6->oc_to,s,argc,argv);
  }
  backtracer_stack = fatso->m_next;
  freebytes(fatso,0x70);
  return;
}

Assistant:

static void backtracer_anything(t_backtracer *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_msgstack *m = (t_msgstack *)t_getbytes(sizeof(t_msgstack));
    t_outconnect *oc;
    int ncopy = (argc > NARGS ? NARGS : argc), i;
    m->m_next = backtracer_stack;
    backtracer_stack = m;
    m->m_sel = s;
    m->m_argc = argc;
    for (i = 0; i < ncopy; i++)
        m->m_argv[i] = argv[i];
    m->m_owner = x;
    if (backtracer_tracing)
        backtracer_printmsg(x->b_owner, s, argc, argv);
    for (oc = x->b_connections; oc; oc = oc->oc_next)
        typedmess(oc->oc_to, s, argc, argv);
    backtracer_stack = m->m_next;
    t_freebytes(m, sizeof(*m));
}